

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_api.c
# Opt level: O0

MPP_RET hal_avsd_deinit(void *decoder)

{
  MPP_RET MVar1;
  AvsdHalCtx_t *p_hal;
  MPP_RET ret;
  void *decoder_local;
  
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_api","In.","hal_avsd_deinit");
  }
  if (decoder == (void *)0x0) {
    if ((avsd_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avsd_api","input empty(%d).\n",(char *)0x0,0x79);
    }
LAB_00248b44:
    if ((avsd_hal_debug & 8) != 0) {
      _mpp_log_l(4,"hal_avsd_api","Out.","hal_avsd_deinit");
    }
    decoder_local._4_4_ = MPP_OK;
  }
  else {
    p_hal._4_4_ = (**(code **)((long)decoder + 0x20))(decoder);
    if (p_hal._4_4_ < MPP_OK) {
      if ((avsd_hal_debug & 4) != 0) {
        _mpp_log_l(4,"hal_avsd_api","Function error(%d).\n",(char *)0x0,0x7b);
      }
    }
    else {
      if ((*(long *)((long)decoder + 0x80) != 0) &&
         (MVar1 = mpp_dev_deinit(*(MppDev *)((long)decoder + 0x80)), MVar1 != MPP_OK)) {
        _mpp_log_l(2,"hal_avsd_api","mpp_dev_deinit failed. ret: %d\n",(char *)0x0,
                   (ulong)(uint)MVar1);
      }
      if ((*(long *)((long)decoder + 0x68) == 0) ||
         (p_hal._4_4_ = mpp_buffer_group_put(*(MppBufferGroup *)((long)decoder + 0x68)),
         MPP_NOK < p_hal._4_4_)) goto LAB_00248b44;
      if ((avsd_hal_debug & 4) != 0) {
        _mpp_log_l(4,"hal_avsd_api","Function error(%d).\n",(char *)0x0,0x84);
      }
    }
    decoder_local._4_4_ = p_hal._4_4_;
  }
  return decoder_local._4_4_;
}

Assistant:

MPP_RET hal_avsd_deinit(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == decoder);

    FUN_CHECK(ret = p_hal->hal_api.deinit(decoder));
    //!< mpp_dev_init
    if (p_hal->dev) {
        ret = mpp_dev_deinit(p_hal->dev);
        if (ret)
            mpp_err("mpp_dev_deinit failed. ret: %d\n", ret);
    }

    if (p_hal->buf_group) {
        FUN_CHECK(ret = mpp_buffer_group_put(p_hal->buf_group));
    }
__RETURN:
    AVSD_HAL_TRACE("Out.");

    return ret = MPP_OK;
__FAILED:
    return ret;
}